

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfOutputAttacher::drawAttachment
          (BufferTfOutputAttacher *this,GLuint buffer,Surface *dst)

{
  ScaleProgram *pSVar1;
  GLuint buffer_00;
  deUint32 dVar2;
  GLenum err;
  RenderContext *context;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Functions *pFVar4;
  double __x;
  MessageBuilder local_1c8;
  undefined1 local_38 [8];
  VertexArray vao;
  Surface *dst_local;
  BufferTfOutputAttacher *pBStack_10;
  GLuint buffer_local;
  BufferTfOutputAttacher *this_local;
  
  vao.super_ObjectWrapper._16_8_ = dst;
  dst_local._4_4_ = buffer;
  pBStack_10 = this;
  context = deqp::gls::LifetimeTests::details::ContextWrapper::getRenderContext
                      (&(this->super_OutputAttacher).super_ContextWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_38,context);
  buffer_00 = dst_local._4_4_;
  pSVar1 = this->m_program;
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  ScaleProgram::setPos(pSVar1,buffer_00,dVar2);
  pSVar1 = this->m_program;
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_38);
  ScaleProgram::draw(pSVar1,dVar2,1.0,false,(Surface *)vao.super_ObjectWrapper._16_8_);
  deqp::gls::LifetimeTests::details::ContextWrapper::log
            (&(this->super_OutputAttacher).super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1c8,(char (*) [48])"// Drew output image with vertices from buffer ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&dst_local + 4));
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  pFVar4 = deqp::gls::LifetimeTests::details::ContextWrapper::gl
                     (&(this->super_OutputAttacher).super_ContextWrapper);
  err = (*pFVar4->getError)();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x177);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_38);
  return;
}

Assistant:

void BufferTfOutputAttacher::drawAttachment (GLuint buffer, Surface& dst)
{
	VertexArray vao(getRenderContext());

	m_program.setPos(buffer, *vao);
	m_program.draw(*vao, 1.0, false, &dst);
	log() << TestLog::Message
		  << "// Drew output image with vertices from buffer " << buffer
		  << TestLog::EndMessage;
	GLU_CHECK_ERROR(gl().getError());
}